

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportInstallFileGenerator::ComplainAboutMissingTarget
          (cmExportInstallFileGenerator *this,cmGeneratorTarget *depender,
          cmGeneratorTarget *dependee,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *exportFiles)

{
  cmExportSet *pcVar1;
  ostream *poVar2;
  string *psVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  string_view separator;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"install(EXPORT \"",0x10);
  pcVar1 = this->IEGen->ExportSet;
  poVar4 = (ostream *)local_1a0;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(pcVar1->Name)._M_dataplus._M_p,(pcVar1->Name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ...) ",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"includes target \"",0x11);
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(depender);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" which requires target \"",0x19);
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
  if ((exportFiles->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (exportFiles->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    lVar5 = 0x1e;
    pcVar6 = "that is not in any export set.";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "that is not in this export set, but in multiple other export sets: ",0x43);
    separator._M_str = ", ";
    separator._M_len = 2;
    cmJoin(&local_1c0,exportFiles,separator,(string_view)ZEXT816(0));
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "An exported target cannot depend upon another target which is exported multiple times. Consider consolidating the exports of the \""
               ,0x82);
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    lVar5 = 0x1c;
    pcVar6 = "\" target to a single export.";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error(&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return;
}

Assistant:

void cmExportInstallFileGenerator::ComplainAboutMissingTarget(
  cmGeneratorTarget const* depender, cmGeneratorTarget const* dependee,
  std::vector<std::string> const& exportFiles)
{
  std::ostringstream e;
  e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
    << "\" ...) "
    << "includes target \"" << depender->GetName()
    << "\" which requires target \"" << dependee->GetName() << "\" ";
  if (exportFiles.empty()) {
    e << "that is not in any export set.";
  } else {
    e << "that is not in this export set, but in multiple other export sets: "
      << cmJoin(exportFiles, ", ") << ".\n";
    e << "An exported target cannot depend upon another target which is "
         "exported multiple times. Consider consolidating the exports of the "
         "\""
      << dependee->GetName() << "\" target to a single export.";
  }
  cmSystemTools::Error(e.str());
}